

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O3

RelationsMap *
dg::vr::RelationsGraph<dg::vr::ValueRelations>::filterResult
          (Relations *relations,RelationsMap *result)

{
  iterator __position;
  
  __position._M_node = (result->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)__position._M_node != &(result->_M_t)._M_impl.super__Rb_tree_header) {
    if (((ulong)__position._M_node[1]._M_parent & (relations->bits).super__Base_bitset<1UL>._M_w) ==
        0) {
      __position = std::
                   _Rb_tree<std::reference_wrapper<dg::vr::Bucket_const>,std::pair<std::reference_wrapper<dg::vr::Bucket_const>const,dg::vr::Relations>,std::_Select1st<std::pair<std::reference_wrapper<dg::vr::Bucket_const>const,dg::vr::Relations>>,std::less<std::reference_wrapper<dg::vr::Bucket_const>>,std::allocator<std::pair<std::reference_wrapper<dg::vr::Bucket_const>const,dg::vr::Relations>>>
                   ::erase_abi_cxx11_((_Rb_tree<std::reference_wrapper<dg::vr::Bucket_const>,std::pair<std::reference_wrapper<dg::vr::Bucket_const>const,dg::vr::Relations>,std::_Select1st<std::pair<std::reference_wrapper<dg::vr::Bucket_const>const,dg::vr::Relations>>,std::less<std::reference_wrapper<dg::vr::Bucket_const>>,std::allocator<std::pair<std::reference_wrapper<dg::vr::Bucket_const>const,dg::vr::Relations>>>
                                       *)result,__position);
    }
    else {
      __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    }
  }
  return result;
}

Assistant:

static RelationsMap &filterResult(const Relations &relations,
                                      RelationsMap &result) {
        for (auto it = result.begin(); it != result.end();) {
            if (!it->second.anyCommon(relations))
                it = result.erase(it);
            else
                ++it;
        }
        return result;
    }